

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

optional<(anonymous_namespace)::cmSourceInfo> *
anon_unknown.dwarf_12d2857::cmcmd_cmake_ninja_depends_fortran
          (optional<(anonymous_namespace)::cmSourceInfo> *__return_storage_ptr__,string *arg_tdi,
          string *arg_pp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Value *pVVar7;
  _Base_ptr p_Var8;
  const_iterator cVar9;
  _Elt_pointer pEVar10;
  _Rb_tree_node_base *p_Var11;
  string *this;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  const_iterator cVar12;
  string mod;
  string dir_top_bld;
  string module_dir;
  cmSourceReqInfo src_info;
  cmFortranCompiler fc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  cmFortranSourceInfo finfo;
  cmFortranParser parser;
  string local_5a8;
  String local_580;
  pointer local_560;
  pointer local_558;
  undefined1 local_550 [24];
  undefined8 local_538;
  _Alloc_hider local_530;
  undefined1 local_528 [16];
  undefined1 local_518 [8];
  char *pcStack_510;
  undefined1 local_508 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  undefined1 local_4e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  pointer local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_4b0;
  undefined1 *local_498;
  long local_490;
  undefined1 local_488;
  undefined7 uStack_487;
  undefined1 *local_478;
  long local_470;
  undefined1 local_468;
  undefined7 uStack_467;
  undefined1 *local_458;
  long local_450;
  undefined1 local_448;
  undefined7 uStack_447;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  undefined1 local_3f0 [32];
  _Alloc_hider local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  undefined1 local_378 [8];
  size_t local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  undefined1 local_328 [16];
  _Elt_pointer local_318;
  _Elt_pointer local_310;
  _Elt_pointer local_308;
  _Map_pointer local_300;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  undefined1 local_2c8 [16];
  _Base_ptr local_2b8;
  _Rb_tree_node_base *local_2b0;
  _Rb_tree_node_base *local_2a8;
  Location local_2a0;
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  cmFortranParser_s local_238;
  
  (__return_storage_ptr__->super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
  _M_payload.super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_engaged = false;
  local_498 = &local_488;
  local_490 = 0;
  local_488 = 0;
  local_478 = &local_468;
  local_470 = 0;
  local_468 = 0;
  local_458 = &local_448;
  local_450 = 0;
  local_448 = 0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_560 = (pointer)local_550;
  local_558 = (pointer)0x0;
  local_550[0] = 0;
  local_538 = local_528;
  local_530._M_p = (pointer)0x0;
  local_528[0] = 0;
  local_550._16_8_ = arg_pp;
  Json::Value::Value((Value *)&local_438,nullValue);
  std::ifstream::ifstream(&local_238,(arg_tdi->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)local_378);
  bVar4 = Json::Reader::parse((Reader *)local_378,(istream *)&local_238,(Value *)&local_438,false);
  if (!bVar4) {
    p_Var8 = (_Base_ptr)(arg_tdi->_M_dataplus)._M_p;
    sVar2 = arg_tdi->_M_string_length;
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_580,(Reader *)local_378);
    local_518 = (undefined1  [8])&DAT_00000027;
    pcStack_510 = "-E cmake_ninja_depends failed to parse ";
    local_4f8._M_allocated_capacity = local_580._M_string_length;
    local_4f8._8_8_ = local_580._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = (iterator)local_518;
    local_508._0_8_ = sVar2;
    local_508._8_8_ = p_Var8;
    cmCatViews_abi_cxx11_(&local_5a8,views);
    cmSystemTools::Error(&local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,
                      (ulong)(local_5a8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &local_280) {
    operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
  }
  if (local_2f8._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)local_2c8) {
    operator_delete(local_2f8._M_impl.super__Rb_tree_header._M_header._M_right,local_2c8._0_8_ + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)local_328);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_378);
  std::ifstream::~ifstream(&local_238);
  if (bVar4) {
    pVVar7 = Json::Value::operator[]((Value *)&local_438,"dir-top-bld");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar7);
    std::__cxx11::string::operator=((string *)&local_560,(string *)&local_238);
    paVar1 = &local_238.Compiler.Id.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    if (local_558 != (pointer)0x0) {
      local_238.Compiler.Id._M_dataplus._M_p = local_558;
      local_238.Compiler.Id._M_string_length = (size_type)local_560;
      __str._M_str = "/";
      __str._M_len = 1;
      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                         (size_type)(local_558 + -1),1,__str);
      if (iVar6 != 0) {
        std::__cxx11::string::push_back((char)&local_560);
      }
    }
    pVVar7 = Json::Value::operator[]((Value *)&local_438,"include-dirs");
    bVar5 = Json::Value::isArray(pVVar7);
    if (bVar5) {
      cVar12 = Json::Value::begin(pVVar7);
      local_378 = (undefined1  [8])cVar12.super_ValueIteratorBase.current_._M_node;
      local_370 = CONCAT71(local_370._1_7_,cVar12.super_ValueIteratorBase.isNull_);
      cVar12 = Json::Value::end(pVVar7);
      local_518 = (undefined1  [8])cVar12.super_ValueIteratorBase.current_._M_node;
      pcStack_510 = (char *)CONCAT71(pcStack_510._1_7_,cVar12.super_ValueIteratorBase.isNull_);
      while (bVar5 = Json::ValueIteratorBase::isEqual
                               ((ValueIteratorBase *)local_378,(SelfType *)local_518), !bVar5) {
        pVVar7 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_378);
        Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar7);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
          operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                          local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
        }
        Json::ValueIteratorBase::increment((ValueIteratorBase *)local_378);
      }
    }
    pVVar7 = Json::Value::operator[]((Value *)&local_438,"module-dir");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar7);
    std::__cxx11::string::operator=((string *)&local_538,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    if (local_530._M_p != (pointer)0x0) {
      local_238.Compiler.Id._M_dataplus._M_p = local_530._M_p;
      local_238.Compiler.Id._M_string_length = local_538;
      __str_00._M_str = "/";
      __str_00._M_len = 1;
      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                         (size_type)(local_530._M_p + -1),1,__str_00);
      if (iVar6 != 0) {
        std::__cxx11::string::push_back((char)&local_538);
      }
    }
    pVVar7 = Json::Value::operator[]((Value *)&local_438,"compiler-id");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar7);
    std::__cxx11::string::operator=((string *)&local_498,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    pVVar7 = Json::Value::operator[]((Value *)&local_438,"submodule-sep");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar7);
    std::__cxx11::string::operator=((string *)&local_478,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    pVVar7 = Json::Value::operator[]((Value *)&local_438,"submodule-ext");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar7);
    std::__cxx11::string::operator=((string *)&local_458,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value((Value *)&local_438);
    if (bVar4) {
      local_378 = (undefined1  [8])&local_368;
      local_370 = 0;
      local_368._M_local_buf[0] = '\0';
      local_358._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_358._M_impl.super__Rb_tree_header._M_header;
      local_358._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_358._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_358._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_310 = (_Elt_pointer)(local_328 + 8);
      local_328._8_4_ = _S_red;
      local_318 = (_Elt_pointer)0x0;
      local_300 = (_Map_pointer)0x0;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_2f8._M_impl.super__Rb_tree_header._M_header;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2b0 = (_Rb_tree_node_base *)(local_2c8 + 8);
      local_2c8._8_4_ = 0;
      local_2b8 = (_Base_ptr)0x0;
      local_2a0 = (Location)0x0;
      local_438._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_438._M_impl.super__Rb_tree_header._M_header;
      local_438._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_438._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_438._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_438._M_impl.super__Rb_tree_header._M_header._M_right =
           local_438._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3f0._0_8_ = local_3f0 + 0x10;
      local_358._M_impl.super__Rb_tree_header._M_header._M_right =
           local_358._M_impl.super__Rb_tree_header._M_header._M_left;
      local_308 = local_310;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_2a8 = local_2b0;
      std::__cxx11::string::_M_construct<char*>((string *)local_3f0,local_498,local_498 + local_490)
      ;
      local_3d0._M_p = (pointer)&local_3c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d0,local_478,local_478 + local_470);
      local_3b0._M_p = (pointer)&local_3a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,local_458,local_458 + local_450);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_390,&local_408);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&local_268,&local_438);
      cmFortranParser_s::cmFortranParser_s
                (&local_238,(cmFortranCompiler *)local_3f0,&local_390,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268,(cmFortranSourceInfo *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_268);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_p != &local_3a0) {
        operator_delete(local_3b0._M_p,local_3a0._M_allocated_capacity + 1);
      }
      uVar3 = local_550._16_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_p != &local_3c0) {
        operator_delete(local_3d0._M_p,local_3c0._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
        operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
      }
      bVar4 = cmFortranParser_FilePush(&local_238,*(char **)uVar3);
      if (bVar4) {
        iVar6 = cmFortran_yyparse(local_238.Scanner);
        if (iVar6 == 0) {
          local_508._8_8_ = (_Base_ptr)0x0;
          vStack_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4b8 = (pointer)0x0;
          vStack_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_4c8._M_allocated_capacity = 0;
          local_4c8._8_8_ = (pointer)0x0;
          local_4d8._M_allocated_capacity = 0;
          local_4d8._8_8_ = (pointer)0x0;
          local_4e8._0_8_ = (pointer)0x0;
          local_4e8._8_8_ = (pointer)0x0;
          local_4f8._M_allocated_capacity = 0;
          local_4f8._8_8_ = (pointer)0x0;
          local_518 = (undefined1  [8])local_508;
          pcStack_510 = (char *)0x0;
          local_508._0_8_ = 0;
          if ((__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_engaged == true)
          {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_518);
            local_5a8._M_dataplus._M_p =
                 *(pointer *)
                  &(__return_storage_ptr__->
                   super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
                   super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                   _M_value.ScanDep.ExtraOutputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl;
            local_5a8._M_string_length =
                 *(size_type *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.ExtraOutputs + 8);
            local_5a8.field_2._M_allocated_capacity =
                 (size_type)
                 *(pointer *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.ExtraOutputs + 0x10);
            *(size_type *)
             &(__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              ScanDep.ExtraOutputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl = local_4f8._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.ExtraOutputs + 8) = local_4f8._8_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.ExtraOutputs + 0x10) = local_4e8._0_8_;
            local_4f8._M_allocated_capacity = 0;
            local_4f8._8_8_ = (pointer)0x0;
            local_4e8._0_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_5a8);
            local_5a8._M_dataplus._M_p =
                 *(pointer *)
                  &(__return_storage_ptr__->
                   super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
                   super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                   _M_value.ScanDep.Provides.
                   super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl;
            local_5a8._M_string_length =
                 *(size_type *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Provides + 8);
            local_5a8.field_2._M_allocated_capacity =
                 (size_type)
                 *(pointer *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Provides + 0x10);
            *(undefined8 *)
             &(__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              ScanDep.Provides.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>
              ._M_impl = local_4e8._8_8_;
            *(size_type *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.Provides + 8) = local_4d8._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.Provides + 0x10) = local_4d8._8_8_;
            local_4e8._8_8_ = (pointer)0x0;
            local_4d8._M_allocated_capacity = 0;
            local_4d8._8_8_ = (pointer)0x0;
            std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                      ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_5a8);
            local_5a8._M_dataplus._M_p =
                 *(pointer *)
                  &(__return_storage_ptr__->
                   super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
                   super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                   _M_value.ScanDep.Requires.
                   super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl;
            local_5a8._M_string_length =
                 *(size_type *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Requires + 8);
            local_5a8.field_2._M_allocated_capacity =
                 (size_type)
                 *(pointer *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Requires + 0x10);
            *(size_type *)
             &(__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              ScanDep.Requires.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>
              ._M_impl = local_4c8._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.Requires + 8) = local_4c8._8_8_;
            *(pointer *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.Requires + 0x10) = local_4b8;
            local_4c8._M_allocated_capacity = 0;
            local_4c8._8_8_ = (pointer)0x0;
            local_4b8 = (pointer)0x0;
            std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                      ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_5a8);
            local_5a8._M_dataplus._M_p =
                 *(pointer *)
                  &(__return_storage_ptr__->
                   super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                   _M_payload.
                   super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
                   super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                   _M_value.Includes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl;
            local_5a8._M_string_length =
                 *(size_type *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.Includes.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 8);
            local_5a8.field_2._M_allocated_capacity =
                 (size_type)
                 *(pointer *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.Includes.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 0x10);
            *(pointer *)
             &(__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              Includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl = vStack_4b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.Includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             + 8) = vStack_4b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
            *(pointer *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.Includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             + 0x10) = vStack_4b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            vStack_4b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_4b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_4b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_5a8);
          }
          else {
            std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::
            _M_construct<(anonymous_namespace)::cmSourceInfo>
                      ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)
                       __return_storage_ptr__,(cmSourceInfo *)local_518);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&vStack_4b0);
          std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                    ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_4c8);
          std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                    ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)(local_4e8 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_4f8);
          if (local_518 != (undefined1  [8])local_508) {
            operator_delete((void *)local_518,local_508._0_8_ + 1);
          }
          if ((_Rb_tree_header *)local_358._M_impl.super__Rb_tree_header._M_header._M_left !=
              &local_358._M_impl.super__Rb_tree_header) {
            this = (string *)
                   &(__return_storage_ptr__->
                    super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                    _M_payload.
                    super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                    .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                    _M_value.ScanDep.Provides;
            p_Var8 = local_358._M_impl.super__Rb_tree_header._M_header._M_left;
            local_550._16_8_ = this;
            do {
              local_518 = (undefined1  [8])local_508;
              pcStack_510 = (char *)0x0;
              local_508._0_8_ = local_508._0_8_ & 0xffffffffffffff00;
              local_4f8._8_8_ = (pointer)0x0;
              local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffffffffff00;
              local_4d8._8_8_ = (pointer)0x0;
              local_4c8._M_allocated_capacity = local_4c8._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_4b8 = (pointer)CONCAT62(local_4b8._2_6_,0x100);
              local_4b8 = (pointer)((ulong)local_4b8 & 0xffffffff);
              local_4f8._M_allocated_capacity = (size_type)local_4e8;
              local_4d8._M_allocated_capacity = (size_type)&local_4c8;
              std::__cxx11::string::_M_assign((string *)local_518);
              if (local_530._M_p != (pointer)0x0) {
                local_5a8.field_2._8_8_ = *(undefined8 *)(p_Var8 + 1);
                local_5a8.field_2._M_allocated_capacity = (size_type)p_Var8[1]._M_parent;
                local_5a8._M_dataplus._M_p = local_530._M_p;
                local_5a8._M_string_length = local_538;
                views_01._M_len = 2;
                views_01._M_array = (iterator)&local_5a8;
                cmCatViews_abi_cxx11_(&local_580,views_01);
                if (local_558 != (pointer)0x0) {
                  local_5a8._M_dataplus._M_p = (pointer)local_580._M_string_length;
                  local_5a8._M_string_length = (size_type)local_580._M_dataplus._M_p;
                  __str_01._M_str = (char *)local_560;
                  __str_01._M_len = (size_t)local_558;
                  iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_5a8,
                                     0,(size_type)local_558,__str_01);
                  if (iVar6 == 0) {
                    std::__cxx11::string::substr((ulong)&local_5a8,(ulong)&local_580);
                    std::__cxx11::string::operator=((string *)&local_580,(string *)&local_5a8);
                    this = (string *)local_550._16_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                      operator_delete(local_5a8._M_dataplus._M_p,
                                      (ulong)(local_5a8.field_2._M_allocated_capacity + 1));
                      this = (string *)local_550._16_8_;
                    }
                  }
                }
                std::__cxx11::string::operator=
                          ((string *)local_4d8._M_local_buf,(string *)&local_580);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_580._M_dataplus._M_p != &local_580.field_2) {
                  operator_delete(local_580._M_dataplus._M_p,
                                  local_580.field_2._M_allocated_capacity + 1);
                }
              }
              std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
              emplace_back<cmSourceReqInfo&>
                        ((vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)this,
                         (cmSourceReqInfo *)local_518);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_allocated_capacity != &local_4c8) {
                operator_delete((void *)local_4d8._M_allocated_capacity,
                                (ulong)(local_4c8._M_allocated_capacity + 1));
              }
              if ((undefined1 *)local_4f8._M_allocated_capacity != local_4e8) {
                operator_delete((void *)local_4f8._M_allocated_capacity,(ulong)(local_4e8._0_8_ + 1)
                               );
              }
              if (local_518 != (undefined1  [8])local_508) {
                operator_delete((void *)local_518,local_508._0_8_ + 1);
              }
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
            } while ((_Rb_tree_header *)p_Var8 != &local_358._M_impl.super__Rb_tree_header);
          }
          if (local_310 != (_Elt_pointer)(local_328 + 8)) {
            pEVar10 = local_310;
            do {
              cVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_358,(key_type *)&(pEVar10->message_)._M_string_length);
              if ((_Rb_tree_header *)cVar9._M_node == &local_358._M_impl.super__Rb_tree_header) {
                local_518 = (undefined1  [8])local_508;
                pcStack_510 = (char *)0x0;
                local_508._0_8_ = local_508._0_8_ & 0xffffffffffffff00;
                local_4f8._M_allocated_capacity = (size_type)local_4e8;
                local_4f8._8_8_ = (pointer)0x0;
                local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffffffffff00;
                local_4d8._8_8_ = (pointer)0x0;
                local_4c8._M_allocated_capacity =
                     local_4c8._M_allocated_capacity & 0xffffffffffffff00;
                local_4b8 = (pointer)CONCAT62(local_4b8._2_6_,0x100);
                local_4b8 = (pointer)((ulong)local_4b8 & 0xffffffff);
                local_4d8._M_allocated_capacity = (size_type)&local_4c8;
                std::__cxx11::string::_M_assign((string *)local_518);
                std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
                emplace_back<cmSourceReqInfo&>
                          ((vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)
                           &(__return_storage_ptr__->
                            super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)
                            ._M_payload.
                            super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                            .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                            _M_payload._M_value.ScanDep.Requires,(cmSourceReqInfo *)local_518);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_allocated_capacity != &local_4c8) {
                  operator_delete((void *)local_4d8._M_allocated_capacity,
                                  (ulong)(local_4c8._M_allocated_capacity + 1));
                }
                if ((undefined1 *)local_4f8._M_allocated_capacity != local_4e8) {
                  operator_delete((void *)local_4f8._M_allocated_capacity,
                                  (ulong)(local_4e8._0_8_ + 1));
                }
                if (local_518 != (undefined1  [8])local_508) {
                  operator_delete((void *)local_518,local_508._0_8_ + 1);
                }
              }
              pEVar10 = (_Elt_pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)pEVar10);
            } while (pEVar10 != (_Elt_pointer)(local_328 + 8));
          }
          if (local_2b0 != (_Rb_tree_node_base *)(local_2c8 + 8)) {
            p_Var11 = local_2b0;
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&(__return_storage_ptr__->
                           super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                           _M_payload.
                           super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                           .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                           _M_payload._M_value.Includes,(value_type *)(p_Var11 + 1));
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
            } while (p_Var11 != (_Rb_tree_node_base *)(local_2c8 + 8));
          }
        }
      }
      else {
        local_508._8_8_ = *(undefined8 *)uVar3;
        local_508._0_8_ = *(size_type *)(uVar3 + 8);
        local_518 = (undefined1  [8])0x26;
        pcStack_510 = "-E cmake_ninja_depends failed to open ";
        views_00._M_len = 2;
        views_00._M_array = (iterator)local_518;
        cmCatViews_abi_cxx11_(&local_5a8,views_00);
        cmSystemTools::Error(&local_5a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,
                          (ulong)(local_5a8.field_2._M_allocated_capacity + 1));
        }
      }
      cmFortranParser_s::~cmFortranParser_s(&local_238);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_438);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_2f8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_358);
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,
                        CONCAT71(local_368._M_allocated_capacity._1_7_,local_368._M_local_buf[0]) +
                        1);
      }
      if ((pointer)local_538 != (pointer)local_528) {
        operator_delete((void *)local_538,CONCAT71(local_528._1_7_,local_528[0]) + 1);
      }
      if (local_560 != (pointer)local_550) {
        operator_delete(local_560,CONCAT71(local_550._1_7_,local_550[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_408);
      if (local_458 != &local_448) {
        operator_delete(local_458,CONCAT71(uStack_447,local_448) + 1);
      }
      if (local_478 != &local_468) {
        operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
      }
      if (local_498 == &local_488) {
        return __return_storage_ptr__;
      }
      operator_delete(local_498,CONCAT71(uStack_487,local_488) + 1);
      return __return_storage_ptr__;
    }
  }
  else {
    Json::Value::~Value((Value *)&local_438);
  }
  if ((pointer)local_538 != (pointer)local_528) {
    operator_delete((void *)local_538,CONCAT71(local_528._1_7_,local_528[0]) + 1);
  }
  if (local_560 != (pointer)local_550) {
    operator_delete(local_560,CONCAT71(local_550._1_7_,local_550[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408);
  if (local_458 != &local_448) {
    operator_delete(local_458,CONCAT71(uStack_447,local_448) + 1);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
  }
  if (local_498 != &local_488) {
    operator_delete(local_498,CONCAT71(uStack_487,local_488) + 1);
  }
  if (bVar4) {
    std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::_M_reset
              ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)__return_storage_ptr__
              );
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmSourceInfo> cmcmd_cmake_ninja_depends_fortran(
  std::string const& arg_tdi, std::string const& arg_pp)
{
  cm::optional<cmSourceInfo> info;
  cmFortranCompiler fc;
  std::vector<std::string> includes;
  std::string dir_top_bld;
  std::string module_dir;
  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error(
          cmStrCat("-E cmake_ninja_depends failed to parse ", arg_tdi,
                   reader.getFormattedErrorMessages()));
        return info;
      }
    }

    dir_top_bld = tdi["dir-top-bld"].asString();
    if (!dir_top_bld.empty() && !cmHasLiteralSuffix(dir_top_bld, "/")) {
      dir_top_bld += '/';
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (auto const& tdi_include_dir : tdi_include_dirs) {
        includes.push_back(tdi_include_dir.asString());
      }
    }

    Json::Value const& tdi_module_dir = tdi["module-dir"];
    module_dir = tdi_module_dir.asString();
    if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
      module_dir += '/';
    }

    Json::Value const& tdi_compiler_id = tdi["compiler-id"];
    fc.Id = tdi_compiler_id.asString();

    Json::Value const& tdi_submodule_sep = tdi["submodule-sep"];
    fc.SModSep = tdi_submodule_sep.asString();

    Json::Value const& tdi_submodule_ext = tdi["submodule-ext"];
    fc.SModExt = tdi_submodule_ext.asString();
  }

  cmFortranSourceInfo finfo;
  std::set<std::string> defines;
  cmFortranParser parser(fc, includes, defines, finfo);
  if (!cmFortranParser_FilePush(&parser, arg_pp.c_str())) {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_depends failed to open ", arg_pp));
    return info;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return info;
  }

  info = cmSourceInfo();
  for (std::string const& provide : finfo.Provides) {
    cmSourceReqInfo src_info;
    src_info.LogicalName = provide;
    if (!module_dir.empty()) {
      std::string mod = cmStrCat(module_dir, provide);
      if (!dir_top_bld.empty() && cmHasPrefix(mod, dir_top_bld)) {
        mod = mod.substr(dir_top_bld.size());
      }
      src_info.CompiledModulePath = std::move(mod);
    }
    info->ScanDep.Provides.emplace_back(src_info);
  }
  for (std::string const& require : finfo.Requires) {
    // Require modules not provided in the same source.
    if (finfo.Provides.count(require)) {
      continue;
    }
    cmSourceReqInfo src_info;
    src_info.LogicalName = require;
    info->ScanDep.Requires.emplace_back(src_info);
  }
  for (std::string const& include : finfo.Includes) {
    info->Includes.push_back(include);
  }
  return info;
}